

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O0

LispPTR rplaca(LispPTR x,LispPTR y)

{
  DLword *pDVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  ConsCell *temp;
  ConsCell *x_68k;
  LispPTR y_local;
  LispPTR x_local;
  
  if ((*(ushort *)((ulong)(MDStypetbl + (x >> 9)) ^ 2) & 0x7ff) == 5) {
    pLVar3 = NativeAligned4FromLAddr(x);
    pDVar1 = MDStypetbl;
    LVar2 = car(x);
    if (((*(ushort *)((ulong)(pDVar1 + (LVar2 >> 9)) ^ 2) & 0x8000) == 0) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        LVar2 = car(x);
        rec_htfind(LVar2,1);
      }
      else {
        LVar2 = car(x);
        htfind(LVar2,1);
      }
    }
    if (((*(ushort *)((ulong)(MDStypetbl + (y >> 9)) ^ 2) & 0x8000) == 0) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        rec_htfind(y,0);
      }
      else {
        htfind(y,0);
      }
    }
    y_local = x;
    if (*pLVar3 >> 0x1c == 0) {
      pLVar3 = NativeAligned4FromLAddr(*pLVar3 & 0xfffffff);
      *pLVar3 = *pLVar3 & 0xf0000000 | y & 0xfffffff;
    }
    else {
      *pLVar3 = *pLVar3 & 0xf0000000 | y & 0xfffffff;
    }
  }
  else {
    if (x == 0) {
      if (y == 0) {
        return 0;
      }
      error("Attempt to RPLACA NIL");
    }
    else {
      error("ARG not List");
    }
    y_local = 0;
  }
  return y_local;
}

Assistant:

LispPTR rplaca(LispPTR x, LispPTR y)
{
  ConsCell *x_68k;
  ConsCell *temp;

#ifdef TRACE2
  printf("TRACE: rplaca()\n");
#endif

  if (Listp(x) == NIL) { /* arg isn't a CONS cell, might be NIL */
    if (x == NIL_PTR) {
      if (y != NIL_PTR)
        error("Attempt to RPLACA NIL");
      else
        return (NIL_PTR);
    } else
      error("ARG not List");
      return (NIL_PTR); /* NOT REACHED */
  }

  else {
    x_68k = (ConsCell *)NativeAligned4FromLAddr(x);

    GCLOOKUP(car(x), DELREF); /* set up reference count */
    GCLOOKUP(y, ADDREF);

    if (x_68k->cdr_code == CDR_INDIRECT) {
      temp = (ConsCell *)NativeAligned4FromLAddr((LispPTR)x_68k->car_field);
      temp->car_field = y;
    } else
      x_68k->car_field = y;

    return (x);
  }
}